

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

void RigidBodyDynamics::ForwardDynamicsAccelerationDeltas
               (Model *model,ConstraintSet *CS,VectorNd *QDDot_t,uint body_id,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  pointer ppCVar9;
  pointer pJVar10;
  pointer pSVar11;
  pointer pSVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  undefined8 uVar17;
  SrcEvaluatorType srcEvaluator_1;
  long lVar18;
  ulong uVar19;
  double *pdVar20;
  ulong uVar21;
  double dVar22;
  ulong uVar23;
  double *pdVar24;
  long lVar25;
  uint uVar26;
  SrcEvaluatorType srcEvaluator;
  Index othersize;
  CustomJoint *pCVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  SpatialVector Xa;
  VectorNd qdd_temp;
  assign_op<double,_double> local_e9;
  SpatialVector local_e8;
  SpatialVector local_b8;
  VectorNd *local_80;
  undefined1 local_78 [16];
  CustomJoint *local_68;
  CustomJoint *local_60;
  ulong local_50;
  long local_48;
  vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *local_40;
  ulong local_38;
  
  lVar18 = (long)(model->mBodies).
                 super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(model->mBodies).
                 super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar18 != 0) {
    uVar19 = (lVar18 >> 4) * 0x6db6db6db6db6db7;
    lVar18 = *(long *)(CS + 0x580);
    lVar7 = *(long *)(CS + 0x598);
    lVar25 = *(long *)(CS + 0x5b0);
    lVar8 = *(long *)(CS + 0x600);
    uVar26 = 1;
    uVar21 = 0;
    do {
      lVar16 = uVar21 * 0x30;
      puVar2 = (undefined8 *)(lVar18 + 0x20 + lVar16);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)(lVar18 + 0x10 + lVar16);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)(lVar18 + lVar16) = 0;
      ((undefined8 *)(lVar18 + lVar16))[1] = 0;
      puVar2 = (undefined8 *)(lVar7 + 0x20 + lVar16);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)(lVar7 + 0x10 + lVar16);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)(lVar7 + lVar16) = 0;
      ((undefined8 *)(lVar7 + lVar16))[1] = 0;
      *(undefined8 *)(lVar25 + uVar21 * 8) = 0;
      *(undefined8 *)(lVar8 + 0x10 + uVar21 * 0x18) = 0;
      puVar2 = (undefined8 *)(lVar8 + uVar21 * 0x18);
      *puVar2 = 0;
      puVar2[1] = 0;
      uVar21 = (ulong)uVar26;
      uVar26 = uVar26 + 1;
    } while (uVar21 <= uVar19 && uVar19 - uVar21 != 0);
  }
  ppCVar9 = (model->mCustomJoints).
            super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar18 = (long)(model->mCustomJoints).
                 super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar9;
  local_40 = f_t;
  if (lVar18 != 0) {
    uVar19 = 0;
    uVar21 = 1;
    do {
      pCVar27 = ppCVar9[uVar19];
      lVar7 = *(long *)(pCVar27 + 0xd0);
      if (0 < lVar7) {
        memset(*(void **)(pCVar27 + 200),0,lVar7 << 3);
      }
      bVar13 = uVar21 < (ulong)(lVar18 >> 3);
      uVar19 = uVar21;
      uVar21 = (ulong)((int)uVar21 + 1);
    } while (bVar13);
  }
  local_80 = QDDot_t;
  if (body_id != 0) {
    uVar19 = (ulong)body_id;
    local_38 = uVar19;
    do {
      if (uVar19 == local_38) {
        lVar7 = uVar19 * 0x30;
        Math::SpatialTransform::applyAdjoint
                  (&local_e8,
                   (model->X_base).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar19,
                   (local_40->
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar19);
        lVar18 = *(long *)(CS + 0x580);
        *(ulong *)(lVar18 + lVar7) =
             (ulong)local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[0] ^ 0x8000000000000000;
        ((ulong *)(lVar18 + lVar7))[1] =
             (ulong)-local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[1];
        pdVar24 = (double *)(lVar18 + 0x10 + lVar7);
        *pdVar24 = -local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[2];
        pdVar24[1] = -local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array[3];
        pdVar24 = (double *)(lVar18 + 0x20 + lVar7);
        *pdVar24 = -local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                    array[4];
        pdVar24[1] = -local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array[5];
      }
      pJVar10 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pJVar10[uVar19].mDoFCount == 1) {
        if (pJVar10[uVar19].mJointType == JointTypeCustom) goto LAB_0013e964;
        pSVar12 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar25 = uVar19 * 0x30;
        lVar18 = *(long *)(CS + 0x580);
        lVar7 = *(long *)(CS + 0x5b0);
        pdVar24 = (double *)
                  ((long)&pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar20 = (double *)
                  ((long)&pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar3 = (double *)(lVar18 + 0x10 + lVar25);
        pdVar4 = (double *)(lVar18 + 0x20 + lVar25);
        *(double *)(lVar7 + uVar19 * 8) =
             -(pdVar20[1] * pdVar4[1] + pdVar24[1] * pdVar3[1] +
               *(double *)
                ((long)&pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
               ((double *)(lVar18 + lVar25))[1] +
              *pdVar20 * *pdVar4 + *pdVar24 * *pdVar3 +
              *(double *)
               &pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
              *(double *)(lVar18 + lVar25));
        uVar21 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar19];
        if (uVar21 != 0) {
          pdVar20 = (double *)(lVar25 + lVar18);
          pSVar12 = (model->U).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar5 = *(double *)(lVar7 + uVar19 * 8);
          auVar29._0_8_ =
               *(double *)
                &pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar5;
          auVar29._8_8_ =
               *(double *)
                ((long)&pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) * dVar5;
          dVar22 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[uVar19];
          auVar30._8_8_ = dVar22;
          auVar30._0_8_ = dVar22;
          auVar30 = divpd(auVar29,auVar30);
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               auVar30._0_8_ + *pdVar20;
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               auVar30._8_8_ + pdVar20[1];
          pdVar24 = (double *)
                    ((long)&pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          auVar31._0_8_ = *pdVar24 * dVar5;
          auVar31._8_8_ = pdVar24[1] * dVar5;
          auVar14._8_8_ = dVar22;
          auVar14._0_8_ = dVar22;
          auVar30 = divpd(auVar31,auVar14);
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               auVar30._0_8_ + pdVar20[2];
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
               auVar30._8_8_ + pdVar20[3];
          lVar25 = uVar21 * 0x30;
          pdVar24 = (double *)
                    ((long)&pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          auVar28._0_8_ = dVar5 * *pdVar24;
          auVar28._8_8_ = dVar5 * pdVar24[1];
          auVar15._8_8_ = dVar22;
          auVar15._0_8_ = dVar22;
          auVar30 = divpd(auVar28,auVar15);
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
               auVar30._0_8_ + pdVar20[4];
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
               auVar30._8_8_ + pdVar20[5];
          Math::SpatialTransform::applyTranspose
                    ((model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar19,&local_b8);
          lVar7 = *(long *)(CS + 0x580);
          dVar5 = ((double *)(lVar18 + lVar25))[1];
          *(double *)(lVar7 + lVar25) =
               *(double *)(lVar18 + lVar25) +
               local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0];
          ((double *)(lVar7 + lVar25))[1] =
               dVar5 + local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                       .array[1];
          pdVar24 = (double *)(lVar18 + 0x10 + lVar25);
          dVar5 = pdVar24[1];
          pdVar20 = (double *)(lVar7 + 0x10 + lVar25);
          *pdVar20 = *pdVar24 +
                     local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[2];
          pdVar20[1] = dVar5 + local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[3];
          pdVar24 = (double *)(lVar18 + 0x20 + lVar25);
          dVar5 = pdVar24[1];
          pdVar20 = (double *)(lVar7 + 0x20 + lVar25);
          *pdVar20 = *pdVar24 +
                     local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[4];
          pdVar20[1] = dVar5 + local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[5];
        }
      }
      else if ((pJVar10[uVar19].mDoFCount == 3) && (pJVar10[uVar19].mJointType != JointTypeCustom))
      {
        local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar19);
        local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)(*(long *)(CS + 0x580) + uVar19 * 0x30);
        local_50 = uVar19 * 0x18;
        Vector3_t::operator=
                  ((Vector3_t *)(*(long *)(CS + 0x600) + local_50),
                   (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                    *)&local_e8);
        uVar21 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar19];
        if (uVar21 != 0) {
          local_48 = *(long *)(CS + 0x580);
          lVar7 = uVar21 * 0x30;
          pSVar11 = (model->X_lambda).
                    super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_78._0_8_ = uVar19 * 0x30 + local_48;
          local_78._8_8_ =
               (model->multdof3_U).
               super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar19;
          local_68 = (CustomJoint *)
                     ((model->multdof3_Dinv).
                      super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar19);
          local_60 = (CustomJoint *)(local_50 + *(long *)(CS + 0x600));
          SpatialVector_t::
          SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                    (&local_b8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                      *)local_78);
          Math::SpatialTransform::applyTranspose(pSVar11 + uVar19,&local_b8);
          lVar18 = *(long *)(CS + 0x580);
          dVar5 = ((double *)(local_48 + lVar7))[1];
          *(double *)(lVar18 + lVar7) =
               *(double *)(local_48 + lVar7) +
               local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [0];
          ((double *)(lVar18 + lVar7))[1] =
               dVar5 + local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                       .array[1];
          pdVar24 = (double *)(local_48 + 0x10 + lVar7);
          dVar5 = pdVar24[1];
          pdVar20 = (double *)(lVar18 + 0x10 + lVar7);
          *pdVar20 = *pdVar24 +
                     local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[2];
          pdVar20[1] = dVar5 + local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[3];
          pdVar24 = (double *)(local_48 + 0x20 + lVar7);
          dVar5 = pdVar24[1];
          pdVar20 = (double *)(lVar18 + 0x20 + lVar7);
          *pdVar20 = *pdVar24 +
                     local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[4];
          pdVar20[1] = dVar5 + local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                               m_storage.m_data.array[5];
        }
      }
      else {
LAB_0013e964:
        if (pJVar10[uVar19].mJointType == JointTypeCustom) {
          local_50 = (ulong)pJVar10[uVar19].custom_joint_index;
          pCVar27 = (model->mCustomJoints).
                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_50];
          lVar18 = uVar19 * 0x30;
          pdVar24 = (double *)(*(long *)(CS + 0x580) + lVar18);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               0.0;
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               0.0;
          if (*(long *)(pCVar27 + 0x80) != 0) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_e8,
                       *(long *)(pCVar27 + 0x80),1);
          }
          if (local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
              != *(double *)(pCVar27 + 0x80)) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_e8,
                       (Index)*(double *)(pCVar27 + 0x80),1);
          }
          dVar5 = local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[0];
          if (0 < (long)local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array[1]) {
            lVar7 = *(long *)(pCVar27 + 0x78);
            pdVar20 = (double *)(*(long *)(pCVar27 + 0x70) + 0x20);
            dVar22 = 0.0;
            do {
              *(double *)
               ((long)&((PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                       local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                       .array[0])->m_storage + (long)dVar22 * 8) =
                   ((pdVar24[1] * -pdVar20[-3] - pdVar20[-1] * pdVar24[3]) - pdVar20[1] * pdVar24[5]
                   ) + ((*pdVar24 * -pdVar20[-4] - pdVar20[-2] * pdVar24[2]) - *pdVar20 * pdVar24[4]
                       );
              dVar22 = (double)((long)dVar22 + 1);
              pdVar20 = pdVar20 + lVar7;
            } while (local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[1] != dVar22);
          }
          if (*(double *)(pCVar27 + 0xd0) !=
              local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
             ) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(pCVar27 + 200),
                       (Index)local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[1],1);
          }
          lVar7 = *(long *)(pCVar27 + 200);
          uVar21 = *(ulong *)(pCVar27 + 0xd0);
          uVar23 = uVar21 - ((long)uVar21 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar21) {
            lVar25 = 0;
            do {
              puVar2 = (undefined8 *)
                       ((long)&((PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)dVar5)->
                               m_storage + lVar25 * 8);
              uVar17 = puVar2[1];
              puVar1 = (undefined8 *)(lVar7 + lVar25 * 8);
              *puVar1 = *puVar2;
              puVar1[1] = uVar17;
              lVar25 = lVar25 + 2;
            } while (lVar25 < (long)uVar23);
          }
          if ((long)uVar23 < (long)uVar21) {
            do {
              *(undefined8 *)(lVar7 + uVar23 * 8) =
                   *(undefined8 *)
                    ((long)&((PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)dVar5)->
                            m_storage + uVar23 * 8);
              uVar23 = uVar23 + 1;
            } while (uVar21 != uVar23);
          }
          free((void *)local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                       .array[0]);
          uVar21 = (ulong)(model->lambda).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar19];
          if (uVar21 != 0) {
            lVar7 = *(long *)(CS + 0x580);
            lVar25 = uVar21 * 0x30;
            pSVar11 = (model->X_lambda).
                      super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_78._0_8_ = lVar7 + lVar18;
            local_60 = (model->mCustomJoints).
                       super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_50];
            local_78._8_8_ = local_60 + 0x88;
            local_68 = local_60 + 0xa0;
            local_60 = local_60 + 200;
            local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
                 *(double *)(lVar7 + lVar18);
            local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
                 (double)((long *)(lVar7 + lVar18))[1];
            puVar2 = (undefined8 *)(lVar7 + 0x10 + lVar18);
            local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
                 (double)*puVar2;
            local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
                 (double)puVar2[1];
            pdVar24 = (double *)(lVar7 + 0x20 + lVar18);
            local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
                 *pdVar24;
            local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
                 pdVar24[1];
            local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
                 1.0;
            Eigen::internal::
            generic_product_impl<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
            ::scaleAndAddTo<Eigen::Matrix<double,6,1,0,6,1>>
                      (&local_b8.super_Matrix<double,_6,_1,_0,_6,_1>,
                       (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                        *)(local_78 + 8),(Matrix<double,__1,_1,_0,__1,_1> *)local_60,
                       (Scalar *)&local_e8);
            Math::SpatialTransform::applyTranspose(pSVar11 + uVar19,&local_b8);
            lVar18 = *(long *)(CS + 0x580);
            dVar5 = ((double *)(lVar7 + lVar25))[1];
            *(double *)(lVar18 + lVar25) =
                 *(double *)(lVar7 + lVar25) +
                 local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0];
            ((double *)(lVar18 + lVar25))[1] =
                 dVar5 + local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[1];
            pdVar24 = (double *)(lVar7 + 0x10 + lVar25);
            dVar5 = pdVar24[1];
            pdVar20 = (double *)(lVar18 + 0x10 + lVar25);
            *pdVar20 = *pdVar24 +
                       local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                       .array[2];
            pdVar20[1] = dVar5 + local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[3];
            pdVar24 = (double *)(lVar7 + 0x20 + lVar25);
            dVar5 = pdVar24[1];
            pdVar20 = (double *)(lVar18 + 0x20 + lVar25);
            *pdVar20 = *pdVar24 +
                       local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                       .array[4];
            pdVar20[1] = dVar5 + local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                 m_storage.m_data.array[5];
          }
        }
      }
      uVar19 = uVar19 - 1;
    } while ((int)uVar19 != 0);
  }
  *(local_80->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = 0.0
  ;
  pSVar12 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar2 = *(undefined8 **)(CS + 0x598);
  dVar5 = *(double *)
           ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
  *puVar2 = *(undefined8 *)
             &(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
  puVar2[1] = dVar5;
  dVar5 = *(double *)
           ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
  puVar2[2] = *(double *)
               ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
  puVar2[3] = dVar5;
  dVar5 = *(double *)
           ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
  puVar2[4] = *(double *)
               ((long)&(pSVar12->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
  puVar2[5] = dVar5;
  if (1 < (ulong)(((long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7)) {
    uVar19 = 1;
    do {
      uVar26 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar19].q_index;
      Math::SpatialTransform::apply
                ((model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar19,
                 (SpatialVector *)
                 ((ulong)(model->lambda).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar19] * 0x30 + *(long *)(CS + 0x598)));
      pJVar10 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pJVar10[uVar19].mDoFCount == 1) {
        if (pJVar10[uVar19].mJointType == JointTypeCustom) goto LAB_0013efb6;
        lVar7 = uVar19 * 0x30;
        pSVar12 = (model->U).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar24 = (double *)
                  ((long)&pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar20 = (double *)
                  ((long)&pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar22 = (*(double *)(*(long *)(CS + 0x5b0) + uVar19 * 8) -
                 (pdVar20[1] *
                  local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[5] +
                  pdVar24[1] *
                  local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[3] +
                  *(double *)
                   ((long)&pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                  local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array[1] +
                 *pdVar20 *
                 local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [4] + *pdVar24 *
                       local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                       .array[2] +
                 *(double *)
                  &pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                 local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [0])) / (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[uVar19];
        (local_80->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar26] = dVar22;
        pSVar12 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar18 = *(long *)(CS + 0x598);
        dVar5 = *(double *)
                 ((long)&pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(double *)(lVar18 + lVar7) =
             *(double *)
              &pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar22 +
             local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
        ((double *)(lVar18 + lVar7))[1] =
             dVar5 * dVar22 +
             local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
        pdVar24 = (double *)
                  ((long)&pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar5 = pdVar24[1];
        pdVar20 = (double *)(lVar18 + 0x10 + lVar7);
        *pdVar20 = *pdVar24 * dVar22 +
                   local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[2];
        pdVar20[1] = dVar5 * dVar22 +
                     local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[3];
        pdVar24 = (double *)
                  ((long)&pSVar12[uVar19].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar5 = pdVar24[1];
        pdVar20 = (double *)(lVar18 + 0x20 + lVar7);
        *pdVar20 = dVar22 * *pdVar24 +
                   local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[4];
        pdVar20[1] = dVar22 * dVar5 +
                     local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[5];
      }
      else if ((pJVar10[uVar19].mDoFCount == 3) && (pJVar10[uVar19].mJointType != JointTypeCustom))
      {
        local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((model->multdof3_Dinv).
                      super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar19);
        local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)(uVar19 * 0x18 + *(long *)(CS + 0x600));
        local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)((model->multdof3_U).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar19);
        local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
             (double)&local_e8;
        Vector3_t::
        Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                  ((Vector3_t *)local_78,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                    *)&local_b8);
        pdVar24 = (local_80->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        pdVar24[uVar26] = (double)local_78._0_8_;
        pdVar24[uVar26 + 1] = (double)local_78._8_8_;
        pdVar24[uVar26 + 2] = (double)local_68;
        local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)((model->a).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar19);
        local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)((model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar19);
        local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)local_78;
        SpatialVector_t::operator=
                  ((SpatialVector_t *)
                   local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0],(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                             *)&local_b8);
        local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             (double)((model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar19);
        local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             (double)&local_e8;
        local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             (double)local_78;
        SpatialVector_t::operator=
                  ((SpatialVector_t *)(uVar19 * 0x30 + *(long *)(CS + 0x598)),
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)&local_b8);
      }
      else {
LAB_0013efb6:
        if (pJVar10[uVar19].mJointType == JointTypeCustom) {
          uVar6 = pJVar10[uVar19].custom_joint_index;
          pCVar27 = (CustomJoint *)
                    (ulong)*(uint *)((model->mCustomJoints).
                                     super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar6] + 8);
          local_78._0_8_ = (double *)0x0;
          local_78._8_8_ = (CustomJoint *)0x0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_78,
                     (Index)pCVar27,1);
          if ((CustomJoint *)local_78._8_8_ != pCVar27) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_78,
                       (Index)pCVar27,1);
          }
          if (0 < (long)local_78._8_8_) {
            memset((void *)local_78._0_8_,0,local_78._8_8_ << 3);
          }
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)(model->mCustomJoints).
                       super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar6];
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)((long)local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[2] + 0xa0);
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               (double)((long)local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[2] + 200);
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)((long)local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[2] + 0x88);
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
               (double)&local_e8;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)local_78,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>
                      *)&local_b8,&local_e9,(type)0x0);
          if (pCVar27 != (CustomJoint *)0x0) {
            pdVar24 = (local_80->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            lVar18 = 0;
            do {
              pdVar24[uVar26 + (int)lVar18] = *(double *)(local_78._0_8_ + lVar18 * 8);
              lVar18 = lVar18 + 1;
            } while (pCVar27 != (CustomJoint *)lVar18);
          }
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)((model->a).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar19);
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               (double)((model->mCustomJoints).
                        super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar6] + 0x70);
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)local_78;
          SpatialVector_t::operator=
                    ((SpatialVector_t *)
                     local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[0],(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                               *)&local_b8);
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               (double)((model->mCustomJoints).
                        super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar6] + 0x70);
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)&local_e8;
          local_b8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)local_78;
          SpatialVector_t::operator=
                    ((SpatialVector_t *)(uVar19 * 0x30 + *(long *)(CS + 0x598)),
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                      *)&local_b8);
          free((void *)local_78._0_8_);
        }
      }
      uVar19 = (ulong)((int)uVar19 + 1);
      uVar21 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    } while (uVar19 <= uVar21 && uVar21 - uVar19 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsAccelerationDeltas (
  Model &model,
  ConstraintSet &CS,
  VectorNd &QDDot_t,
  const unsigned int body_id,
  const std::vector<SpatialVector> &f_t
)
{
  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (CS.d_pA.size() == model.mBodies.size());
  assert (CS.d_a.size() == model.mBodies.size());
  assert (CS.d_u.size() == model.mBodies.size());

  // TODO reset all values (debug)
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    CS.d_pA[i].setZero();
    CS.d_a[i].setZero();
    CS.d_u[i] = 0.;
    CS.d_multdof3_u[i].setZero();
  }
  for(unsigned int i=0; i<model.mCustomJoints.size(); i++) {
    model.mCustomJoints[i]->d_u.setZero();
  }

  for (unsigned int i = body_id; i > 0; i--) {
    if (i == body_id) {
      CS.d_pA[i] = -model.X_base[i].applyAdjoint(f_t[i]);
    }

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_multdof3_u[i] = - model.multdof3_S[i].transpose() * (CS.d_pA[i]);

      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =   CS.d_pA[lambda]
                            + model.X_lambda[i].applyTranspose (
                              CS.d_pA[i] + (model.multdof3_U[i]
                                            * model.multdof3_Dinv[i]
                                            * CS.d_multdof3_u[i]));
      }
    } else if(model.mJoints[i].mDoFCount == 1
              && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_u[i] = - model.S[i].dot(CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        CS.d_pA[lambda] = CS.d_pA[lambda]
                          + model.X_lambda[i].applyTranspose (
                            CS.d_pA[i] + model.U[i] * CS.d_u[i] / model.d[i]);
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {

      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      //CS.
      model.mCustomJoints[kI]->d_u =
        - model.mCustomJoints[kI]->S.transpose() * (CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =
          CS.d_pA[lambda]
          + model.X_lambda[i].applyTranspose (
            CS.d_pA[i] + (   model.mCustomJoints[kI]->U
                             * model.mCustomJoints[kI]->Dinv
                             * model.mCustomJoints[kI]->d_u)
          );
      }
    }
  }

  for (unsigned int i = 0; i < f_t.size(); i++) {
    LOG << "f_t[" << i << "] = " << f_t[i].transpose() << std::endl;
  }

  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_pA[i] " << CS.d_pA[i].transpose() << std::endl;
  }
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_u[i] = " << CS.d_u[i] << std::endl;
  }

  QDDot_t[0] = 0.;
  CS.d_a[0] = model.a[0];

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];

    SpatialVector Xa = model.X_lambda[i].apply(CS.d_a[lambda]);

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = model.multdof3_Dinv[i]
                          * (CS.d_multdof3_u[i] - model.multdof3_U[i].transpose() * Xa);

      QDDot_t[q_index] = qdd_temp[0];
      QDDot_t[q_index + 1] = qdd_temp[1];
      QDDot_t[q_index + 2] = qdd_temp[2];
      model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
      CS.d_a[i] = Xa + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mDoFCount == 1
               && model.mJoints[i].mJointType != JointTypeCustom) {

      QDDot_t[q_index] = (CS.d_u[i] - model.U[i].dot(Xa) ) / model.d[i];
      CS.d_a[i] = Xa + model.S[i] * QDDot_t[q_index];
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd qdd_temp = VectorNd::Zero(dofI);

      qdd_temp = model.mCustomJoints[kI]->Dinv
                 * (model.mCustomJoints[kI]->d_u
                    - model.mCustomJoints[kI]->U.transpose() * Xa);

      for(int z=0; z<dofI; ++z) {
        QDDot_t[q_index+z] = qdd_temp[z];
      }

      model.a[i] = model.a[i] + model.mCustomJoints[kI]->S * qdd_temp;
      CS.d_a[i] = Xa + model.mCustomJoints[kI]->S * qdd_temp;
    }

    LOG << "QDDot_t[" << i - 1 << "] = " << QDDot_t[i - 1] << std::endl;
    LOG << "d_a[i] = " << CS.d_a[i].transpose() << std::endl;
  }
}